

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buildvm_lib.c
# Opt level: O3

void libdef_name(char *p,int kind)

{
  uint8_t *__dest;
  uint uVar1;
  char *__s;
  size_t sVar2;
  int iVar3;
  size_t sVar4;
  uint uVar5;
  BuildCtx *ctx;
  long lVar6;
  ulong uVar7;
  long lVar8;
  uint8_t *puVar9;
  int *piVar10;
  undefined8 uStack_140;
  ulong uStack_138;
  undefined8 uStack_130;
  undefined8 uStack_128;
  undefined4 uStack_120;
  int iStack_11c;
  undefined2 uStack_118;
  undefined8 uStack_114;
  int iStack_10c;
  int iStack_108;
  undefined4 uStack_104;
  undefined1 auStack_100 [44];
  undefined2 uStack_d4;
  undefined4 uStack_c8;
  int iStack_c4;
  int iStack_c0;
  undefined2 uStack_b8;
  undefined8 uStack_b4;
  undefined2 uStack_ac;
  undefined4 uStack_a0;
  int iStack_9c;
  int iStack_98;
  undefined2 uStack_90;
  undefined4 uStack_8c;
  undefined8 uStack_88;
  int iStack_78;
  int iStack_74;
  undefined4 uStack_64;
  BuildCtx *pBStack_58;
  
  ctx = (BuildCtx *)p;
  sVar4 = strlen(p);
  sVar2 = modnamelen;
  if (((kind != 0xc0) && (modnamelen < sVar4)) && (p[modnamelen] == '_')) {
    ctx = (BuildCtx *)p;
    iVar3 = strncmp(p,modname,modnamelen);
    if (iVar3 == 0) {
      p = p + sVar2 + 1;
      sVar4 = sVar4 - (sVar2 + 1);
    }
  }
  if (sVar4 < 0x39) {
    if (optr + sVar4 + 3 < (uint8_t *)((long)&optr + 1U)) {
      __dest = optr + 1;
      puVar9 = optr + sVar4 + 1;
      *optr = (byte)kind | (byte)sVar4;
      memcpy(__dest,p,sVar4);
      optr = puVar9;
      return;
    }
  }
  else {
    ctx = (BuildCtx *)p;
    libdef_name_cold_2();
  }
  libdef_name_cold_1();
  pBStack_58 = (BuildCtx *)p;
  memset(auStack_100 + 5,0,0x97);
  auStack_100[0] = '.';
  auStack_100[1] = 't';
  auStack_100[2] = 'e';
  auStack_100[3] = 'x';
  auStack_100[4] = 't';
  auStack_100._20_4_ = 0xb4;
  auStack_100._16_4_ = (undefined4)ctx->codesz;
  auStack_100._24_4_ = auStack_100._16_4_ + 0xb4;
  uVar5 = ctx->nreloc & 0xffff;
  auStack_100._32_2_ = (undefined2)ctx->nreloc;
  iVar3 = auStack_100._16_4_ + 0xb4 + uVar5 * 10;
  auStack_100._36_8_ = 0x6164702e60500020;
  uStack_d4 = 0x6174;
  uStack_c8 = 0x18;
  iStack_c0 = auStack_100._16_4_ + 0xcc + uVar5 * 10;
  uStack_b8 = 6;
  iStack_9c = auStack_100._16_4_ + 0x108 + uVar5 * 10;
  uStack_b4 = 0x6164782e40300040;
  uStack_ac = 0x6174;
  uStack_a0 = 0x20;
  iStack_98 = auStack_100._16_4_ + 0x128 + uVar5 * 10;
  uStack_90 = 1;
  iStack_74 = auStack_100._16_4_ + 0x132 + uVar5 * 10;
  uStack_8c = 0x40300040;
  uStack_88 = 0x5a2461746164722e;
  iStack_c4 = iVar3;
  sVar4 = strlen(ctx->dasm_ident);
  iStack_78 = (int)sVar4 + 1;
  iStack_10c = (int)sVar4 + iVar3 + 0x7f;
  uStack_64 = 0x40300040;
  uStack_114 = 0x48664;
  uStack_104 = 0;
  uVar5 = ctx->nrelocsym;
  iStack_108 = uVar5 + 0xb + ctx->nsym;
  owrite(ctx,&uStack_114,0x14);
  owrite(ctx,auStack_100,0xa0);
  owrite(ctx,ctx->code,ctx->codesz);
  if (0 < ctx->nreloc) {
    piVar10 = &ctx->reloc[0].type;
    lVar6 = 0;
    do {
      uStack_140 = CONCAT44(piVar10[-1] + 3,((BuildReloc *)(piVar10 + -2))->ofs);
      uStack_138 = CONCAT62(uStack_138._2_6_,(*piVar10 != 0) + 2 + (ushort)(*piVar10 != 0));
      owrite(ctx,&uStack_140,10);
      lVar6 = lVar6 + 1;
      piVar10 = piVar10 + 3;
    } while (lVar6 < ctx->nreloc);
  }
  uVar1 = ctx->sym[(long)ctx->nsym + -1].ofs;
  uStack_140 = (ulong)uVar1 << 0x20;
  uStack_138 = uStack_138 & 0xffffffff00000000;
  owrite(ctx,&uStack_140,0xc);
  uStack_140 = CONCAT44((int)ctx->codesz,uVar1);
  uStack_138 = CONCAT44(uStack_138._4_4_,0x14);
  owrite(ctx,&uStack_140,0xc);
  uStack_120 = 0;
  iVar3 = uVar5 + 8;
  uStack_118 = 3;
  iStack_11c = iVar3;
  owrite(ctx,&uStack_120,10);
  uStack_120 = 4;
  uStack_118 = 3;
  iStack_11c = iVar3;
  owrite(ctx,&uStack_120,10);
  uStack_120 = 8;
  uStack_118 = 3;
  iStack_11c = uVar5 + 5;
  owrite(ctx,&uStack_120,10);
  uStack_120 = 0xc;
  uStack_118 = 3;
  iStack_11c = iVar3;
  owrite(ctx,&uStack_120,10);
  uStack_120 = 0x10;
  uStack_118 = 3;
  iStack_11c = iVar3;
  owrite(ctx,&uStack_120,10);
  uStack_120 = 0x14;
  uStack_118 = 3;
  iStack_11c = uVar5 + 5;
  owrite(ctx,&uStack_120,10);
  uStack_140 = 0x3000420000050019;
  uStack_138 = 0x500070006000;
  uStack_130 = 0x1504000100000000;
  uStack_128 = 0x5000300002000300;
  owrite(ctx,&uStack_140,0x20);
  uStack_120 = 0x10;
  uStack_118 = 3;
  iStack_11c = uVar5 + 7;
  owrite(ctx,&uStack_120,10);
  __s = ctx->dasm_ident;
  sVar4 = strlen(__s);
  owrite(ctx,__s,sVar4 + 1);
  strtab = (char *)0x0;
  while( true ) {
    strtabofs = 4;
    emit_peobj_sym(ctx,"@feat.00",1,-2,0,3);
    emit_peobj_sym_sect(ctx,(PEsection *)auStack_100,0);
    if (0 < (int)uVar5) {
      uVar7 = 0;
      do {
        emit_peobj_sym(ctx,ctx->relocsym[uVar7],0,-1,0x20,2);
        uVar7 = uVar7 + 1;
      } while (uVar5 != uVar7);
    }
    emit_peobj_sym_sect(ctx,(PEsection *)auStack_100,1);
    emit_peobj_sym_sect(ctx,(PEsection *)auStack_100,2);
    emit_peobj_sym(ctx,"lj_err_unwind_win",0,-1,0x20,2);
    emit_peobj_sym(ctx,ctx->beginsym,0,0,0,2);
    if (0 < ctx->nsym) {
      lVar6 = 8;
      lVar8 = 0;
      do {
        emit_peobj_sym(ctx,*(char **)((long)ctx->sym + lVar6 + -8),
                       *(uint32_t *)((long)&ctx->sym->name + lVar6),0,0x20,2);
        lVar8 = lVar8 + 1;
        lVar6 = lVar6 + 0x10;
      } while (lVar8 < ctx->nsym);
    }
    emit_peobj_sym_sect(ctx,(PEsection *)auStack_100,3);
    sVar2 = strtabofs;
    if (strtab != (char *)0x0) break;
    strtab = (char *)malloc(strtabofs);
    *(int *)strtab = (int)sVar2;
  }
  owrite(ctx,strtab,strtabofs);
  return;
}

Assistant:

static void libdef_name(const char *p, int kind)
{
  size_t n = strlen(p);
  if (kind != LIBINIT_STRING) {
    if (n > modnamelen && p[modnamelen] == '_' &&
	!strncmp(p, modname, modnamelen)) {
      p += modnamelen+1;
      n -= modnamelen+1;
    }
  }
  if (n > LIBINIT_MAXSTR) {
    fprintf(stderr, "Error: string too long: '%s'\n",  p);
    exit(1);
  }
  if (optr+1+n+2 > obuf+sizeof(obuf)) {  /* +2 for caller. */
    fprintf(stderr, "Error: output buffer overflow\n");
    exit(1);
  }
  *optr++ = (uint8_t)(n | kind);
  memcpy(optr, p, n);
  optr += n;
}